

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void functionDestroy(sqlite3 *db,FuncDef *p)

{
  FuncDestructor *p_00;
  FuncDestructor *pDestructor;
  FuncDef *p_local;
  sqlite3 *db_local;
  
  p_00 = (p->u).pDestructor;
  if ((p_00 != (FuncDestructor *)0x0) && (p_00->nRef = p_00->nRef + -1, p_00->nRef == 0)) {
    (*p_00->xDestroy)(p_00->pUserData);
    sqlite3DbFree(db,p_00);
  }
  return;
}

Assistant:

static void functionDestroy(sqlite3 *db, FuncDef *p){
  FuncDestructor *pDestructor = p->u.pDestructor;
  if( pDestructor ){
    pDestructor->nRef--;
    if( pDestructor->nRef==0 ){
      pDestructor->xDestroy(pDestructor->pUserData);
      sqlite3DbFree(db, pDestructor);
    }
  }
}